

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordGeodetic.h
# Opt level: O0

void __thiscall
CoordGeodetic::CoordGeodetic(CoordGeodetic *this,double lat,double lon,double alt,bool is_radians)

{
  double dVar1;
  bool is_radians_local;
  double alt_local;
  double lon_local;
  double lat_local;
  CoordGeodetic *this_local;
  
  if (is_radians) {
    this->latitude = lat;
    this->longitude = lon;
  }
  else {
    dVar1 = Util::DegreesToRadians(lat);
    this->latitude = dVar1;
    dVar1 = Util::DegreesToRadians(lon);
    this->longitude = dVar1;
  }
  this->altitude = alt;
  return;
}

Assistant:

CoordGeodetic(
            double lat,
            double lon,
            double alt,
            bool is_radians = false)
    {
        if (is_radians)
        {
            latitude = lat;
            longitude = lon;
        }
        else
        {
            latitude = Util::DegreesToRadians(lat);
            longitude = Util::DegreesToRadians(lon);
        }
        altitude = alt;
    }